

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

uint32_t helper_sve_pnext_aarch64(void *vd,void *vg,uint32_t pred_desc)

{
  ulong uVar1;
  byte bVar2;
  uint32_t flags;
  ulong uVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint64_t d;
  uint uVar9;
  ulong uVar10;
  
  uVar9 = pred_desc & 0x1f;
  uVar10 = (ulong)uVar9;
  uVar5 = pred_desc >> 10 & 3;
  uVar1 = pred_esz_masks_aarch64[uVar5];
  uVar6 = uVar10 + 1;
  uVar3 = (ulong)(uVar9 << 6);
LAB_00495142:
  uVar3 = uVar3 - 0x40;
  uVar8 = *(ulong *)((long)vd + uVar6 * 8 + -0x10) & uVar1;
  sVar4 = (sbyte)uVar5;
  if (uVar8 == 0) goto code_r0x0049514c;
  uVar6 = 0x3f;
  if (uVar8 != 0) {
    for (; uVar8 >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0x3f) + uVar3 ^ 0x3f;
  goto LAB_00495170;
code_r0x0049514c:
  uVar6 = uVar6 - 1;
  if (uVar6 < 2) goto code_r0x00495159;
  goto LAB_00495142;
code_r0x00495159:
  uVar6 = -1L << sVar4;
LAB_00495170:
  uVar6 = (1L << sVar4) + uVar6;
  if ((long)uVar6 < (long)(ulong)(uVar9 << 6)) {
    bVar2 = (byte)uVar6;
    uVar6 = uVar6 & 0xffffffffffffffc0;
    uVar3 = -1L << (bVar2 & 0x3f);
    do {
      uVar3 = uVar3 & *(ulong *)((long)vg + ((long)uVar6 >> 3)) & uVar1;
      if (uVar3 != 0) {
        lVar7 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar6 = uVar6 + lVar7;
        break;
      }
      uVar6 = uVar6 + 0x40;
      uVar3 = 0xffffffffffffffff;
    } while ((long)uVar6 < (long)(ulong)(uVar9 << 6));
  }
  flags = 1;
  lVar7 = 0;
  do {
    d = 0;
    if ((long)uVar6 / 0x40 == lVar7) {
      d = 1L << ((byte)uVar6 & 0x3f);
    }
    *(uint64_t *)((long)vd + lVar7 * 8) = d;
    flags = iter_predtest_fwd(d,*(ulong *)((long)vg + lVar7 * 8) & uVar1,flags);
    lVar7 = lVar7 + 1;
  } while (uVar10 + (uVar10 == 0) != lVar7);
  return flags;
}

Assistant:

uint32_t HELPER(sve_pnext)(void *vd, void *vg, uint32_t pred_desc)
{
    intptr_t words = extract32(pred_desc, 0, SIMD_OPRSZ_BITS);
    intptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    uint32_t flags = PREDTEST_INIT;
    uint64_t *d = vd, *g = vg, esz_mask;
    intptr_t i, next;

    next = last_active_element(vd, words, esz) + (1ULL << esz);
    esz_mask = pred_esz_masks[esz];

    /* Similar to the pseudocode for pnext, but scaled by ESZ
       so that we find the correct bit.  */
    if (next < words * 64) {
        uint64_t mask = -1;

        if (next & 63) {
            mask = ~((1ull << (next & 63)) - 1);
            next &= -64;
        }
        do {
            uint64_t this_g = g[next / 64] & esz_mask & mask;
            if (this_g != 0) {
                next = (next & -64) + ctz64(this_g);
                break;
            }
            next += 64;
            mask = -1;
        } while (next < words * 64);
    }

    i = 0;
    do {
        uint64_t this_d = 0;
        if (i == next / 64) {
            this_d = 1ull << (next & 63);
        }
        d[i] = this_d;
        flags = iter_predtest_fwd(this_d, g[i] & esz_mask, flags);
    } while (++i < words);

    return flags;
}